

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O0

void __thiscall
BufferedReaderManager::BufferedReaderManager
          (BufferedReaderManager *this,uint32_t readersCnt,uint32_t blockSize,uint32_t allocSize,
          uint32_t prereadThreshold)

{
  BufferedReader *this_00;
  BufferedReader *local_38;
  BufferedReader *reader;
  uint32_t i;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t prereadThreshold_local;
  uint32_t allocSize_local;
  uint32_t blockSize_local;
  uint32_t readersCnt_local;
  BufferedReaderManager *this_local;
  
  local_20 = prereadThreshold;
  local_1c = allocSize;
  prereadThreshold_local = blockSize;
  allocSize_local = readersCnt;
  _blockSize_local = this;
  std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::vector(&this->m_fileReaders);
  init(this,(EVP_PKEY_CTX *)(ulong)prereadThreshold_local);
  for (reader._0_4_ = 0; (uint)reader < allocSize_local; reader._0_4_ = (uint)reader + 1) {
    this_00 = (BufferedReader *)operator_new(0x1d8);
    BufferedFileReader::BufferedFileReader
              ((BufferedFileReader *)this_00,prereadThreshold_local,local_1c,local_20);
    local_38 = this_00;
    BufferedReader::setId(this_00,(uint)reader);
    std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::push_back
              (&this->m_fileReaders,&local_38);
  }
  this->m_readersCnt = allocSize_local;
  return;
}

Assistant:

BufferedReaderManager::BufferedReaderManager(const uint32_t readersCnt, const uint32_t blockSize,
                                             const uint32_t allocSize, const uint32_t prereadThreshold)
{
    init(blockSize, allocSize, prereadThreshold);

    for (uint32_t i = 0; i < readersCnt; i++)
    {
        BufferedReader* reader = new BufferedFileReader(blockSize, allocSize, prereadThreshold);
        reader->setId(i);
        m_fileReaders.push_back(reader);
    }

    m_readersCnt = readersCnt;
}